

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bid_t filemgr_alloc(filemgr *file,err_log_callback *log_callback)

{
  file_status_t fVar1;
  uint64_t uVar2;
  filemgr *in_RDI;
  ssize_t rv;
  uint8_t _buf;
  bid_t bid;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  fdb_status in_stack_0000020c;
  err_log_callback *in_stack_00000210;
  filemgr_ops *in_stack_00000218;
  int64_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bid_t local_18;
  
  pthread_spin_lock(&in_RDI->lock);
  local_18 = 0xffffffffffffffff;
  fVar1 = filemgr_get_file_status((filemgr *)0x111fd2);
  if (((fVar1 == '\0') && (in_RDI->sb != (superblock *)0x0)) &&
     (sb_ops.alloc_block != (_func_bid_t_filemgr_ptr *)0x0)) {
    local_18 = (*sb_ops.alloc_block)(in_RDI);
  }
  if (local_18 == 0xffffffffffffffff) {
    uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                                (memory_order)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    local_18 = uVar2 / in_RDI->blocksize;
    atomic_add_uint64_t((atomic<unsigned_long> *)
                        CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8,memory_order_relaxed);
  }
  if (global_config.ncacheblock < 1) {
    (*in_RDI->ops->pwrite)
              (in_RDI->fd,&stack0xffffffffffffffe7,1,(local_18 + 1) * (ulong)in_RDI->blocksize + -1)
    ;
    _log_errno_str(in_stack_00000218,in_stack_00000210,in_stack_0000020c,in_stack_00000200,
                   in_stack_000001f8);
  }
  pthread_spin_unlock(&in_RDI->lock);
  return local_18;
}

Assistant:

bid_t filemgr_alloc(struct filemgr *file, err_log_callback *log_callback)
{
    spin_lock(&file->lock);
    bid_t bid = BLK_NOT_FOUND;

    // block reusing is not allowed for being compacted file
    // for easy implementation.
    if (filemgr_get_file_status(file) == FILE_NORMAL &&
        file->sb && sb_ops.alloc_block) {
        bid = sb_ops.alloc_block(file);
    }
    if (bid == BLK_NOT_FOUND) {
        bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
        atomic_add_uint64_t(&file->pos, file->blocksize);
    }

    if (global_config.ncacheblock <= 0) {
        // if block cache is turned off, write the allocated block before use
        uint8_t _buf = 0x0;
        ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                       (bid+1) * file->blocksize - 1);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
    }
    spin_unlock(&file->lock);

    return bid;
}